

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_File_write_at_all
              (MPIABI_File fh,MPIABI_Offset offset,void *buf,int count,MPIABI_Datatype datatype,
              MPIABI_Status *status)

{
  undefined8 uVar1;
  int iVar2;
  MPI_Status *mpi_status_ptr;
  
  iVar2 = MPI_File_write_at_all();
  if (status != (MPIABI_Status *)0x0) {
    status->MPI_SOURCE = (status->mpi_status).status_OpenMPI.f0;
    uVar1 = *(undefined8 *)((long)&status->mpi_status + 4);
    status->MPI_TAG = (int)uVar1;
    status->MPI_ERROR = (int)((ulong)uVar1 >> 0x20);
  }
  return iVar2;
}

Assistant:

int MPIABI_File_write_at_all(
  MPIABI_File fh,
  MPIABI_Offset offset,
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  MPIABI_Status * status
) {
  return MPI_File_write_at_all(
    (MPI_File)(WPI_File)fh,
    (MPI_Offset)(WPI_Offset)offset,
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}